

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeNumberConstructor
               (DynamicObject *numberConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  PropertyString *pPVar3;
  undefined4 *puVar4;
  Var pvVar5;
  double dVar6;
  double next;
  double dVar7;
  
  DeferredTypeHandlerBase::Convert(typeHandler,numberConstructor,mode,0x11,0);
  this = (((numberConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(numberConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (numberConstructor,0x124,(this->super_JavascriptLibraryBase).numberPrototype.ptr,0,0,0,0
            );
  pPVar3 = ScriptContext::GetPropertyString(this_00,0x10b);
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(numberConstructor,0x106,pPVar3,2,0,0,0);
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (numberConstructor,0x100,(this->super_JavascriptLibraryBase).maxValue.ptr,0,0,0,0);
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (numberConstructor,0x104,(this->super_JavascriptLibraryBase).minValue.ptr,0,0,0,0);
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (numberConstructor,0x105,(this->super_JavascriptLibraryBase).nan.ptr,0,0,0,0);
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (numberConstructor,0x10e,(this->super_JavascriptLibraryBase).negativeInfinite.ptr,0,0,0,
             0);
  (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (numberConstructor,0x121,(this->super_JavascriptLibraryBase).positiveInfinite.ptr,0,0,0,
             0);
  if (((this_00->config).threadConfig)->m_ES6Number == true) {
    dVar6 = 0.0;
    for (dVar7 = 1.0; (dVar7 + 1.0 != 1.0 || (NAN(dVar7 + 1.0))); dVar7 = dVar7 * 0.5) {
      dVar6 = dVar7;
    }
    if ((dVar6 != 2.220446049250313e-16) || (NAN(dVar6))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0xfdf,"(epsilon == Math::EPSILON)","epsilon == Math::EPSILON");
      if (!bVar2) goto LAB_00aa0353;
      *puVar4 = 0;
    }
    pvVar5 = JavascriptNumber::ToVar(2.220446049250313e-16);
    (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (numberConstructor,0x7d,pvVar5,0,0,0,0);
    pvVar5 = JavascriptNumber::ToVar(9007199254740991.0);
    (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (numberConstructor,0xff,pvVar5,0,0,0,0);
    pvVar5 = JavascriptNumber::ToVar(-9007199254740991.0);
    (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (numberConstructor,0x103,pvVar5,0,0,0,0);
    if ((this->parseIntFunctionObject).ptr == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0xfe5,"(library->parseIntFunctionObject != nullptr)",
                                  "Where is parseIntFunctionObject? Should have been initialized with Global object initialization"
                                 );
      if (!bVar2) goto LAB_00aa0353;
      *puVar4 = 0;
    }
    if ((this->parseFloatFunctionObject).ptr == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0xfe6,"(library->parseFloatFunctionObject != nullptr)",
                                  "Where is parseIntFunctionObject? Should have been initialized with Global object initialization"
                                 );
      if (!bVar2) {
LAB_00aa0353:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (numberConstructor,0x11f,(this->parseIntFunctionObject).ptr,6,0,0,0);
    (*(numberConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (numberConstructor,0x11e,(this->parseFloatFunctionObject).ptr,6,0,0,0);
    AddFunctionToLibraryObject
              (this,numberConstructor,0xc4,(FunctionInfo *)JavascriptNumber::EntryInfo::IsNaN,1,
               '\x06');
    AddFunctionToLibraryObject
              (this,numberConstructor,0xc1,(FunctionInfo *)JavascriptNumber::EntryInfo::IsFinite,1,
               '\x06');
    AddFunctionToLibraryObject
              (this,numberConstructor,0xc3,(FunctionInfo *)JavascriptNumber::EntryInfo::IsInteger,1,
               '\x06');
    AddFunctionToLibraryObject
              (this,numberConstructor,0xc6,
               (FunctionInfo *)JavascriptNumber::EntryInfo::IsSafeInteger,1,'\x06');
  }
  DynamicObject::SetHasNoEnumerableProperties(numberConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeNumberConstructor(DynamicObject* numberConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(numberConstructor, mode, 17);

        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterNumber
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = numberConstructor->GetScriptContext();
        JavascriptLibrary* library = numberConstructor->GetLibrary();
        library->AddMember(numberConstructor, PropertyIds::length,            TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(numberConstructor, PropertyIds::prototype,         library->numberPrototype,     PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Number), PropertyConfigurable);
        library->AddMember(numberConstructor, PropertyIds::MAX_VALUE,         library->maxValue,            PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::MIN_VALUE,         library->minValue,            PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::NaN,               library->nan,                 PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::NEGATIVE_INFINITY, library->negativeInfinite,    PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::POSITIVE_INFINITY, library->positiveInfinite,    PropertyNone);

        if (scriptContext->GetConfig()->IsES6NumberExtensionsEnabled())
        {
#ifdef DBG
            double epsilon = 0.0;
            for (double next = 1.0; next + 1.0 != 1.0; next = next / 2.0)
            {
                epsilon = next;
            }
            Assert(epsilon == Math::EPSILON);
#endif
            library->AddMember(numberConstructor, PropertyIds::EPSILON,     JavascriptNumber::New(Math::EPSILON,     scriptContext), PropertyNone);
            library->AddMember(numberConstructor, PropertyIds::MAX_SAFE_INTEGER, JavascriptNumber::New(Math::MAX_SAFE_INTEGER, scriptContext), PropertyNone);
            library->AddMember(numberConstructor, PropertyIds::MIN_SAFE_INTEGER, JavascriptNumber::New(Math::MIN_SAFE_INTEGER, scriptContext), PropertyNone);

            AssertMsg(library->parseIntFunctionObject != nullptr, "Where is parseIntFunctionObject? Should have been initialized with Global object initialization");
            AssertMsg(library->parseFloatFunctionObject != nullptr, "Where is parseIntFunctionObject? Should have been initialized with Global object initialization");
            library->AddMember(numberConstructor, PropertyIds::parseInt, library->parseIntFunctionObject);
            library->AddMember(numberConstructor, PropertyIds::parseFloat, library->parseFloatFunctionObject);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isNaN, &JavascriptNumber::EntryInfo::IsNaN, 1);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isFinite, &JavascriptNumber::EntryInfo::IsFinite, 1);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isInteger, &JavascriptNumber::EntryInfo::IsInteger, 1);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isSafeInteger, &JavascriptNumber::EntryInfo::IsSafeInteger, 1);
        }

        numberConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }